

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::SharedMemoryArbiterImpl::FlushPendingCommitDataRequests
          (SharedMemoryArbiterImpl *this,function<void_()> *callback)

{
  uint uVar1;
  TaskRunner *pTVar2;
  pointer pCVar3;
  ProducerEndpoint *pPVar4;
  _Manager_type p_Var5;
  undefined8 uVar6;
  int iVar7;
  CommitDataRequest_ChunksToMove *ctm;
  pointer pCVar8;
  CommitDataRequest *pCVar9;
  unique_lock<std::mutex> scoped_lock;
  _Any_data local_128;
  _Manager_type local_118;
  _Invoker_type local_110;
  unique_ptr<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
  *local_108;
  function<void_()> *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  WeakPtr<perfetto::SharedMemoryArbiterImpl> weak_this;
  Chunk chunk;
  _Any_data local_b8;
  pointer local_a8;
  pointer pCStack_a0;
  function<void_()> local_60;
  Chunk local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&scoped_lock,&this->lock_);
  if (this->fully_bound_ == false) {
    if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
                (&this->pending_flush_callbacks_,callback);
    }
    std::unique_lock<std::mutex>::~unique_lock(&scoped_lock);
    return;
  }
  pTVar2 = this->task_runner_;
  iVar7 = (*pTVar2->_vptr_TaskRunner[6])(pTVar2);
  if ((char)iVar7 == '\0') {
    std::unique_lock<std::mutex>::unlock(&scoped_lock);
    std::__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
               &weak_this,
               (__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
               &this->weak_ptr_factory_);
    std::__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2> *)
               &chunk,(__shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>
                       *)&weak_this);
    ::std::function<void_()>::function((function<void_()> *)&local_b8,(function<void_()> *)callback)
    ;
    local_e8 = (code *)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = operator_new(0x30);
    uVar6 = chunk._8_8_;
    chunk.size_ = 0;
    chunk.chunk_idx_ = '\0';
    chunk._11_5_ = 0;
    *(uint8_t **)local_f8._M_unused._0_8_ = chunk.begin_;
    *(undefined8 *)((long)local_f8._M_unused._0_8_ + 8) = uVar6;
    chunk.begin_ = (uint8_t *)0x0;
    *(undefined8 *)((long)local_f8._M_unused._0_8_ + 0x10) = 0;
    *(undefined8 *)((long)local_f8._M_unused._0_8_ + 0x18) = 0;
    *(undefined8 *)((long)local_f8._M_unused._0_8_ + 0x20) = 0;
    *(pointer *)((long)local_f8._M_unused._0_8_ + 0x28) = pCStack_a0;
    if (local_a8 != (pointer)0x0) {
      *(void **)((long)local_f8._M_unused._0_8_ + 0x10) = local_b8._M_unused._M_object;
      *(undefined8 *)((long)local_f8._M_unused._0_8_ + 0x18) = local_b8._8_8_;
      *(pointer *)((long)local_f8._M_unused._0_8_ + 0x20) = local_a8;
      local_a8 = (pointer)0x0;
      pCStack_a0 = (pointer)0x0;
    }
    pcStack_e0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:38782:29)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:38782:29)>
               ::_M_manager;
    (*pTVar2->_vptr_TaskRunner[2])(pTVar2);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    FlushPendingCommitDataRequests(std::function<void()>)::$_0::~__0((__0 *)&chunk);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&weak_this.handle_.
                super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else if ((this->commit_data_req_)._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
           .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl !=
           (CommitDataRequest *)0x0) {
    local_100 = (function<void_()> *)callback;
    ReplaceCommitPlaceholderBufferIdsLocked(this);
    local_108 = &this->commit_data_req_;
    pCVar9 = (this->commit_data_req_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl;
    pCVar3 = (pCVar9->chunks_to_move_).
             super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar8 = *(pointer *)
                   &(pCVar9->chunks_to_move_).
                    super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
                    ._M_impl; pCVar8 != pCVar3; pCVar8 = pCVar8 + 1) {
      uVar1 = *(uint *)((this->shmem_abi_).start_ +
                       (ulong)pCVar8->page_ * (this->shmem_abi_).page_size_);
      if ((uVar1 >> ((char)pCVar8->chunk_ * '\x02' & 0x1fU) & 3) == 1) {
        SharedMemoryABI::GetChunkUnchecked
                  ((SharedMemoryABI *)&chunk,(size_t)&this->shmem_abi_,pCVar8->page_,(ulong)uVar1);
        SharedMemoryABI::Chunk::Chunk(&local_40,&chunk);
        SharedMemoryABI::ReleaseChunkAsComplete(&this->shmem_abi_,&local_40);
      }
    }
    pCVar9 = (local_108->_M_t).
             super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
             .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl;
    (local_108->_M_t).
    super___uniq_ptr_impl<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::protos::gen::CommitDataRequest_*,_std::default_delete<perfetto::protos::gen::CommitDataRequest>_>
    .super__Head_base<0UL,_perfetto::protos::gen::CommitDataRequest_*,_false>._M_head_impl =
         (CommitDataRequest *)0x0;
    local_108[1] = (__uniq_ptr_data<perfetto::protos::gen::CommitDataRequest,_std::default_delete<perfetto::protos::gen::CommitDataRequest>,_true,_true>
                    )0x0;
    callback = (function<void_()> *)local_100;
    goto LAB_002e9b5a;
  }
  pCVar9 = (CommitDataRequest *)0x0;
LAB_002e9b5a:
  std::unique_lock<std::mutex>::~unique_lock(&scoped_lock);
  if ((char)iVar7 == '\0') {
    if (pCVar9 == (CommitDataRequest *)0x0) {
      return;
    }
  }
  else {
    if (pCVar9 == (CommitDataRequest *)0x0) {
      if ((((function<void_()> *)callback)->super__Function_base)._M_manager == (_Manager_type)0x0)
      {
        return;
      }
      pPVar4 = this->producer_endpoint_;
      protos::gen::CommitDataRequest::CommitDataRequest((CommitDataRequest *)&chunk);
      local_128._M_unused._M_object = (void *)0x0;
      local_128._8_8_ = 0;
      local_118 = (_Manager_type)0x0;
      local_110 = ((function<void_()> *)callback)->_M_invoker;
      p_Var5 = (((function<void_()> *)callback)->super__Function_base)._M_manager;
      if (p_Var5 != (_Manager_type)0x0) {
        local_128._M_unused._0_8_ =
             (undefined8)
             *(undefined8 *)&(((function<void_()> *)callback)->super__Function_base)._M_functor;
        local_128._8_8_ =
             *(undefined8 *)
              ((long)&(((function<void_()> *)callback)->super__Function_base)._M_functor + 8);
        (((function<void_()> *)callback)->super__Function_base)._M_manager = (_Manager_type)0x0;
        ((function<void_()> *)callback)->_M_invoker = (_Invoker_type)0x0;
        local_118 = p_Var5;
      }
      (*pPVar4->_vptr_ProducerEndpoint[7])(pPVar4,&chunk,&local_128);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_128);
      protos::gen::CommitDataRequest::~CommitDataRequest((CommitDataRequest *)&chunk);
      return;
    }
    pPVar4 = this->producer_endpoint_;
    ::std::function<void_()>::function(&local_60,(function<void_()> *)callback);
    (*pPVar4->_vptr_ProducerEndpoint[7])(pPVar4,pCVar9,&local_60);
    ::std::_Function_base::~_Function_base(&local_60.super__Function_base);
  }
  (*(pCVar9->super_CppMessageObj)._vptr_CppMessageObj[1])(pCVar9);
  return;
}

Assistant:

void SharedMemoryArbiterImpl::FlushPendingCommitDataRequests(
    std::function<void()> callback) {
  std::unique_ptr<CommitDataRequest> req;
  {
    std::unique_lock<std::mutex> scoped_lock(lock_);

    // Flushing is only supported while |fully_bound_|, and there may still be
    // unbound startup trace writers. If so, skip the commit for now - it'll be
    // done when |fully_bound_| is updated.
    if (!fully_bound_) {
      if (callback)
        pending_flush_callbacks_.push_back(callback);
      return;
    }

    // May be called by TraceWriterImpl on any thread.
    base::TaskRunner* task_runner = task_runner_;
    if (!task_runner->RunsTasksOnCurrentThread()) {
      // We shouldn't post a task while holding a lock. |task_runner| remains
      // valid after unlocking, because |task_runner_| is never reset.
      scoped_lock.unlock();

      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner->PostTask([weak_this, callback] {
        if (weak_this)
          weak_this->FlushPendingCommitDataRequests(std::move(callback));
      });
      return;
    }

    // |commit_data_req_| could have become a nullptr, for example when a forced
    // sync flush happens in GetNewChunk().
    if (commit_data_req_) {
      // Make sure any placeholder buffer IDs from StartupWriters are replaced
      // before sending the request.
      bool all_placeholders_replaced =
          ReplaceCommitPlaceholderBufferIdsLocked();
      // We're |fully_bound_|, thus all writers are bound and all placeholders
      // should have been replaced.
      PERFETTO_DCHECK(all_placeholders_replaced);

      // In order to allow patching in the producer we delay the kChunkComplete
      // transition and keep batched chunks in the kChunkBeingWritten state.
      // Since we are about to notify the service of all batched chunks, it will
      // not be possible to apply any more patches to them and we need to move
      // them to kChunkComplete - otherwise the service won't look at them.
      for (auto& ctm : commit_data_req_->chunks_to_move()) {
        uint32_t layout = shmem_abi_.GetPageLayout(ctm.page());
        auto chunk_state =
            shmem_abi_.GetChunkStateFromLayout(layout, ctm.chunk());
        // Note: the subset of |commit_data_req_| chunks that still need
        // patching is also the subset of chunks that are still being written
        // to. The rest of the chunks in |commit_data_req_| do not need patching
        // and have already been marked as complete.
        if (chunk_state != SharedMemoryABI::kChunkBeingWritten)
          continue;

        SharedMemoryABI::Chunk chunk =
            shmem_abi_.GetChunkUnchecked(ctm.page(), layout, ctm.chunk());
        shmem_abi_.ReleaseChunkAsComplete(std::move(chunk));
      }

      req = std::move(commit_data_req_);
      bytes_pending_commit_ = 0;
    }
  }  // scoped_lock

  if (req) {
    producer_endpoint_->CommitData(*req, callback);
  } else if (callback) {
    // If |req| was nullptr, it means that an enqueued deferred commit was
    // executed just before this. At this point send an empty commit request
    // to the service, just to linearize with it and give the guarantee to the
    // caller that the data has been flushed into the service.
    producer_endpoint_->CommitData(CommitDataRequest(), std::move(callback));
  }
}